

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

void __thiscall fast_float::bigint::bigint(bigint *this,uint64_t value)

{
  uint64_t value_local;
  bigint *this_local;
  
  memset(this,0,0x1f8);
  stackvec<(unsigned_short)62>::stackvec(&this->vec);
  stackvec<(unsigned_short)62>::push_unchecked(&this->vec,value);
  stackvec<(unsigned_short)62>::normalize(&this->vec);
  return;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bigint(uint64_t value): vec() {
#ifdef FASTFLOAT_64BIT_LIMB
    vec.push_unchecked(value);
#else
    vec.push_unchecked(uint32_t(value));
    vec.push_unchecked(uint32_t(value >> 32));
#endif
    vec.normalize();
  }